

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

boolean is_chargeable(obj *obj)

{
  bool local_1b;
  bool local_1a;
  bool local_19;
  obj *obj_local;
  
  if (obj->oclass == '\v') {
    obj_local._7_1_ = true;
  }
  else if (obj->oclass == '\x04') {
    local_19 = false;
    if (((byte)objects[obj->otyp].field_0x10 >> 5 & 1) != 0) {
      local_1a = true;
      if ((*(uint *)&obj->field_0x4a >> 4 & 1) == 0) {
        local_1a = objects[obj->otyp].oc_uname != (char *)0x0;
      }
      local_19 = local_1a;
    }
    obj_local._7_1_ = local_19;
  }
  else if ((obj->oclass == '\x06') && (objects[obj->otyp].oc_subtyp != '\0')) {
    obj_local._7_1_ = false;
  }
  else if (obj->oclass == '\x06') {
    local_1b = true;
    if (((((byte)objects[obj->otyp].field_0x10 >> 5 & 1) == 0) &&
        (local_1b = true, obj->otyp != 0xe7)) && (local_1b = true, obj->otyp != 0xe8)) {
      local_1b = obj->otyp == 0xe9;
    }
    obj_local._7_1_ = local_1b;
  }
  else {
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

boolean is_chargeable(struct obj *obj)
{
	if (obj->oclass == WAND_CLASS) return TRUE;
	/* known && !uname is possible after amnesia/mind flayer */
	if (obj->oclass == RING_CLASS)
	    return (boolean)(objects[obj->otyp].oc_charged &&
			(obj->known || objects[obj->otyp].oc_uname));
	if (is_weptool(obj))	/* specific check before general tools */
	    return FALSE;
	/* Magic lamps can't be recharged, but they should be listed
	 * to prevent telling them apart from oil lamps with charging.
	 */
	if (obj->oclass == TOOL_CLASS) {
	    return (boolean)(objects[obj->otyp].oc_charged ||
			     obj->otyp == BRASS_LANTERN ||
			     obj->otyp == OIL_LAMP ||
			     obj->otyp == MAGIC_LAMP);
	}
	return FALSE; /* why are weapons/armor considered charged anyway? */
}